

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O0

escape * __thiscall cppcms::filters::escape::operator=(escape *this,escape *other)

{
  streamable *in_RSI;
  escape *in_RDI;
  
  streamable::operator=(in_RSI,&in_RDI->obj_);
  return in_RDI;
}

Assistant:

escape const &escape::operator=(escape const &other){ obj_ = other.obj_; return *this; }